

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

void __thiscall
cppcms::session_pool::backend
          (session_pool *this,
          unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
          *b)

{
  unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_> *in_RSI
  ;
  unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
  *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>::
  operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void session_pool::backend(std::unique_ptr<session_api_factory> b)
{
	backend_=std::move(b);
}